

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::
ImmutableMessageOneofFieldGenerator
          (ImmutableMessageOneofFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex
          ,int builderBitIndex,Context *context)

{
  OneofDescriptor *oneof;
  OneofGeneratorInfo *info_00;
  OneofGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  ImmutableMessageOneofFieldGenerator *this_local;
  
  ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
            (&this->super_ImmutableMessageFieldGenerator,descriptor,messageBitIndex,builderBitIndex,
             context);
  (this->super_ImmutableMessageFieldGenerator).super_ImmutableFieldGenerator.
  _vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutableMessageOneofFieldGenerator_006f6510;
  oneof = FieldDescriptor::containing_oneof(descriptor);
  info_00 = Context::GetOneofGeneratorInfo(context,oneof);
  SetCommonOneofVariables
            (descriptor,info_00,&(this->super_ImmutableMessageFieldGenerator).variables_);
  return;
}

Assistant:

ImmutableMessageOneofFieldGenerator::
ImmutableMessageOneofFieldGenerator(const FieldDescriptor* descriptor,
                                 int messageBitIndex,
                                 int builderBitIndex,
                                 Context* context)
    : ImmutableMessageFieldGenerator(
          descriptor, messageBitIndex, builderBitIndex, context) {
  const OneofGeneratorInfo* info =
      context->GetOneofGeneratorInfo(descriptor->containing_oneof());
  SetCommonOneofVariables(descriptor, info, &variables_);
}